

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_inscribe(parser *p)

{
  uint32_t uVar1;
  wchar_t tval;
  wchar_t sval;
  char *pcVar2;
  object_kind *poVar3;
  parser_error pVar4;
  
  pcVar2 = (char *)parser_priv(p);
  if (pcVar2 != (char *)0x0) {
    pVar4 = PARSE_ERROR_NONE;
    if (*pcVar2 == '\0') {
      pcVar2 = parser_getsym(p,"tval");
      tval = tval_find_idx(pcVar2);
      if (tval < L'\0') {
        pVar4 = PARSE_ERROR_UNRECOGNISED_TVAL;
      }
      else {
        pcVar2 = parser_getsym(p,"sval");
        sval = lookup_sval(tval,pcVar2);
        pVar4 = PARSE_ERROR_UNRECOGNISED_SVAL;
        if (L'\xffffffff' < sval) {
          poVar3 = lookup_kind(tval,sval);
          if (poVar3 != (object_kind *)0x0) {
            uVar1 = poVar3->kidx;
            pcVar2 = parser_getstr(p,"text");
            add_autoinscription((int16_t)uVar1,pcVar2,true);
            pVar4 = PARSE_ERROR_NONE;
          }
        }
      }
    }
    return pVar4;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                ,0x3a8,"enum parser_error parse_prefs_inscribe(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_inscribe(struct parser *p)
{
	int tvi, svi;
	struct object_kind *kind;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	tvi = tval_find_idx(parser_getsym(p, "tval"));
	if (tvi < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	svi = lookup_sval(tvi, parser_getsym(p, "sval"));
	if (svi < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	kind = lookup_kind(tvi, svi);
	if (!kind)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	add_autoinscription(kind->kidx, parser_getstr(p, "text"), true);

	return PARSE_ERROR_NONE;
}